

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O2

PyObject * __thiscall
boost::python::detail::caller_arity<5U>::
impl<bool_(StimulationCommand::*)(int,_int,_int,_int),_boost::python::default_call_policies,_boost::mpl::vector6<bool,_StimulationCommand_&,_int,_int,_int,_int>_>
::operator()(impl<bool_(StimulationCommand::*)(int,_int,_int,_int),_boost::python::default_call_policies,_boost::mpl::vector6<bool,_StimulationCommand_&,_int,_int,_int,_int>_>
             *this,PyObject *args_,PyObject *param_2)

{
  PyObject *pPVar1;
  c_t0 c0;
  c_t3 c3;
  c_t2 c2;
  c_t1 c1;
  c_t4 c4;
  undefined1 local_a1;
  arg_lvalue_from_python_base local_a0;
  arg_rvalue_from_python<int> local_98;
  arg_rvalue_from_python<int> local_78;
  arg_rvalue_from_python<int> local_58;
  arg_rvalue_from_python<int> local_38;
  
  converter::reference_arg_from_python<StimulationCommand_&>::reference_arg_from_python
            ((reference_arg_from_python<StimulationCommand_&> *)&local_a0,
             (PyObject *)args_[1].ob_type);
  if ((((local_a0.m_result != (void *)0x0) &&
       (converter::arg_rvalue_from_python<int>::arg_rvalue_from_python
                  (&local_58,(PyObject *)args_[2].ob_refcnt),
       local_58.m_data.super_rvalue_from_python_storage<int_&>.stage1.convertible != (void *)0x0))
      && (converter::arg_rvalue_from_python<int>::arg_rvalue_from_python
                    (&local_78,(PyObject *)args_[2].ob_type),
         local_78.m_data.super_rvalue_from_python_storage<int_&>.stage1.convertible != (void *)0x0))
     && (converter::arg_rvalue_from_python<int>::arg_rvalue_from_python
                   (&local_98,(PyObject *)args_[3].ob_refcnt),
        local_98.m_data.super_rvalue_from_python_storage<int_&>.stage1.convertible != (void *)0x0))
  {
    converter::arg_rvalue_from_python<int>::arg_rvalue_from_python
              (&local_38,(PyObject *)args_[3].ob_type);
    if (local_38.m_data.super_rvalue_from_python_storage<int_&>.stage1.convertible != (void *)0x0) {
      pPVar1 = invoke<boost::python::to_python_value<bool_const&>,bool(StimulationCommand::*)(int,int,int,int),boost::python::arg_from_python<StimulationCommand&>,boost::python::arg_from_python<int>,boost::python::arg_from_python<int>,boost::python::arg_from_python<int>,boost::python::arg_from_python<int>>
                         (&local_a1,this,&local_a0,&local_58,&local_78,&local_98,&local_38);
      return pPVar1;
    }
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }